

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_raw_seek(OggVorbis_File *vf,ogg_int64_t pos)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ogg_int64_t oVar4;
  long serialno;
  long lStack_240;
  int link_1;
  ogg_int64_t granulepos;
  int local_230;
  int link;
  int i;
  int result;
  ogg_int64_t pagepos;
  int local_218;
  int firstflag;
  int lastflag;
  int thisblock;
  int accblock;
  int lastblock;
  ogg_packet op;
  ogg_page og;
  ogg_stream_state work_os;
  ogg_int64_t pos_local;
  OggVorbis_File *vf_local;
  
  if (vf->ready_state < 2) {
    vf_local._4_4_ = -0x83;
  }
  else if (vf->seekable == 0) {
    vf_local._4_4_ = -0x8a;
  }
  else if ((pos < 0) || (vf->end < pos)) {
    vf_local._4_4_ = -0x83;
  }
  else {
    if ((2 < vf->ready_state) &&
       ((pos < vf->offsets[vf->current_link] || (vf->offsets[vf->current_link + 1] <= pos)))) {
      _decode_clear(vf);
    }
    vf->pcm_offset = -1;
    ogg_stream_reset_serialno(&vf->os,(int)vf->current_serialno);
    vorbis_synthesis_restart(&vf->vd);
    iVar2 = _seek_helper(vf,pos);
    if (iVar2 == 0) {
      thisblock = 0;
      lastflag = 0;
      local_218 = 0;
      bVar1 = false;
      ogg_stream_init((ogg_stream_state *)&og.body_len,(int)vf->current_serialno);
      ogg_stream_reset((ogg_stream_state *)&og.body_len);
LAB_00250458:
      if ((2 < vf->ready_state) &&
         (iVar2 = ogg_stream_packetout((ogg_stream_state *)&og.body_len,(ogg_packet *)&accblock),
         0 < iVar2)) {
        if (vf->vi[vf->current_link].codec_setup != (void *)0x0) {
          lVar3 = vorbis_packet_blocksize(vf->vi + vf->current_link,(ogg_packet *)&accblock);
          firstflag = (int)lVar3;
          if (firstflag < 0) {
            ogg_stream_packetout(&vf->os,(ogg_packet *)0x0);
            firstflag = 0;
          }
          else if ((local_218 == 0) || (bVar1)) {
            if (thisblock != 0) {
              lastflag = (thisblock + firstflag >> 2) + lastflag;
            }
          }
          else {
            ogg_stream_packetout(&vf->os,(ogg_packet *)0x0);
          }
          if (op.e_o_s != -1) {
            lStack_240 = op.e_o_s - vf->pcmlengths[vf->current_link << 1];
            if (lStack_240 < 0) {
              lStack_240 = 0;
            }
            for (local_230 = 0; local_230 < vf->current_link; local_230 = local_230 + 1) {
              lStack_240 = vf->pcmlengths[local_230 * 2 + 1] + lStack_240;
            }
            vf->pcm_offset = lStack_240 - lastflag;
            if (vf->pcm_offset < 0) {
              vf->pcm_offset = 0;
            }
LAB_00250873:
            ogg_stream_clear((ogg_stream_state *)&og.body_len);
            vf->bittrack = 0.0;
            vf->samptrack = 0.0;
            return 0;
          }
          thisblock = firstflag;
          goto LAB_00250458;
        }
        ogg_stream_packetout(&vf->os,(ogg_packet *)0x0);
      }
      if (thisblock == 0) {
        oVar4 = _get_next_page(vf,(ogg_page *)&op.packetno,-1);
        if (-1 < oVar4) {
          if (((2 < vf->ready_state) &&
              (lVar3 = vf->current_serialno, iVar2 = ogg_page_serialno((ogg_page *)&op.packetno),
              lVar3 != iVar2)) && (iVar2 = ogg_page_bos((ogg_page *)&op.packetno), iVar2 != 0)) {
            _decode_clear(vf);
            ogg_stream_clear((ogg_stream_state *)&og.body_len);
          }
          if (vf->ready_state < 3) goto code_r0x00250739;
          goto LAB_00250832;
        }
        oVar4 = ov_pcm_total(vf,-1);
        vf->pcm_offset = oVar4;
      }
      else {
        vf->pcm_offset = -1;
      }
      goto LAB_00250873;
    }
    vf->pcm_offset = -1;
    _decode_clear(vf);
    vf_local._4_4_ = -0x89;
  }
  return vf_local._4_4_;
code_r0x00250739:
  iVar2 = ogg_page_serialno((ogg_page *)&op.packetno);
  for (serialno._4_4_ = 0;
      (serialno._4_4_ < vf->links && (vf->serialnos[serialno._4_4_] != (long)iVar2));
      serialno._4_4_ = serialno._4_4_ + 1) {
  }
  if (serialno._4_4_ != vf->links) {
    vf->current_link = serialno._4_4_;
    vf->current_serialno = (long)iVar2;
    ogg_stream_reset_serialno(&vf->os,iVar2);
    ogg_stream_reset_serialno((ogg_stream_state *)&og.body_len,iVar2);
    vf->ready_state = 3;
    bVar1 = oVar4 <= vf->dataoffsets[serialno._4_4_];
LAB_00250832:
    ogg_stream_pagein(&vf->os,(ogg_page *)&op.packetno);
    ogg_stream_pagein((ogg_stream_state *)&og.body_len,(ogg_page *)&op.packetno);
    local_218 = ogg_page_eos((ogg_page *)&op.packetno);
  }
  goto LAB_00250458;
}

Assistant:

int ov_raw_seek(OggVorbis_File *vf,ogg_int64_t pos){
  ogg_stream_state work_os;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)
    return(OV_ENOSEEK); /* don't dump machine if we can't seek */

  if(pos<0 || pos>vf->end)return(OV_EINVAL);

  /* is the seek position outside our current link [if any]? */
  if(vf->ready_state>=STREAMSET){
    if(pos<vf->offsets[vf->current_link] || pos>=vf->offsets[vf->current_link+1])
      _decode_clear(vf); /* clear out stream state */
  }

  /* don't yet clear out decoding machine (if it's initialized), in
     the case we're in the same link.  Restart the decode lapping, and
     let _fetch_and_process_packet deal with a potential bitstream
     boundary */
  vf->pcm_offset=-1;
  ogg_stream_reset_serialno(&vf->os,
                            vf->current_serialno); /* must set serialno */
  vorbis_synthesis_restart(&vf->vd);

  if(_seek_helper(vf,pos)) {
    /* dump the machine so we're in a known state */
    vf->pcm_offset=-1;
    _decode_clear(vf);
    return OV_EBADLINK;
  }

  /* we need to make sure the pcm_offset is set, but we don't want to
     advance the raw cursor past good packets just to get to the first
     with a granulepos.  That's not equivalent behavior to beginning
     decoding as immediately after the seek position as possible.

     So, a hack.  We use two stream states; a local scratch state and
     the shared vf->os stream state.  We use the local state to
     scan, and the shared state as a buffer for later decode.

     Unfortuantely, on the last page we still advance to last packet
     because the granulepos on the last page is not necessarily on a
     packet boundary, and we need to make sure the granpos is
     correct.
  */

  {
    ogg_page og;
    ogg_packet op;
    int lastblock=0;
    int accblock=0;
    int thisblock=0;
    int lastflag=0;
    int firstflag=0;
    ogg_int64_t pagepos=-1;

    ogg_stream_init(&work_os,vf->current_serialno); /* get the memory ready */
    ogg_stream_reset(&work_os); /* eliminate the spurious OV_HOLE
                                   return from not necessarily
                                   starting from the beginning */

    while(1){
      if(vf->ready_state>=STREAMSET){
        /* snarf/scan a packet if we can */
        int result=ogg_stream_packetout(&work_os,&op);

        if(result>0){

          if(vf->vi[vf->current_link].codec_setup){
            thisblock=vorbis_packet_blocksize(vf->vi+vf->current_link,&op);
            if(thisblock<0){
              ogg_stream_packetout(&vf->os,NULL);
              thisblock=0;
            }else{

              /* We can't get a guaranteed correct pcm position out of the
                 last page in a stream because it might have a 'short'
                 granpos, which can only be detected in the presence of a
                 preceding page.  However, if the last page is also the first
                 page, the granpos rules of a first page take precedence.  Not
                 only that, but for first==last, the EOS page must be treated
                 as if its a normal first page for the stream to open/play. */
              if(lastflag && !firstflag)
                ogg_stream_packetout(&vf->os,NULL);
              else
                if(lastblock)accblock+=(lastblock+thisblock)>>2;
            }

            if(op.granulepos!=-1){
              int i,link=vf->current_link;
              ogg_int64_t granulepos=op.granulepos-vf->pcmlengths[link*2];
              if(granulepos<0)granulepos=0;

              for(i=0;i<link;i++)
                granulepos+=vf->pcmlengths[i*2+1];
              vf->pcm_offset=granulepos-accblock;
              if(vf->pcm_offset<0)vf->pcm_offset=0;
              break;
            }
            lastblock=thisblock;
            continue;
          }else
            ogg_stream_packetout(&vf->os,NULL);
        }
      }

      if(!lastblock){
        pagepos=_get_next_page(vf,&og,-1);
        if(pagepos<0){
          vf->pcm_offset=ov_pcm_total(vf,-1);
          break;
        }
      }else{
        /* huh?  Bogus stream with packets but no granulepos */
        vf->pcm_offset=-1;
        break;
      }

      /* has our decoding just traversed a bitstream boundary? */
      if(vf->ready_state>=STREAMSET){
        if(vf->current_serialno!=ogg_page_serialno(&og)){

          /* two possibilities:
             1) our decoding just traversed a bitstream boundary
             2) another stream is multiplexed into this logical section? */

          if(ogg_page_bos(&og)){
            /* we traversed */
            _decode_clear(vf); /* clear out stream state */
            ogg_stream_clear(&work_os);
          } /* else, do nothing; next loop will scoop another page */
        }
      }

      if(vf->ready_state<STREAMSET){
        int link;
        long serialno = ogg_page_serialno(&og);

        for(link=0;link<vf->links;link++)
          if(vf->serialnos[link]==serialno)break;

        if(link==vf->links) continue; /* not the desired Vorbis
                                         bitstream section; keep
                                         trying */
        vf->current_link=link;
        vf->current_serialno=serialno;
        ogg_stream_reset_serialno(&vf->os,serialno);
        ogg_stream_reset_serialno(&work_os,serialno);
        vf->ready_state=STREAMSET;
        firstflag=(pagepos<=vf->dataoffsets[link]);
      }

      ogg_stream_pagein(&vf->os,&og);
      ogg_stream_pagein(&work_os,&og);
      lastflag=ogg_page_eos(&og);

    }
  }

  ogg_stream_clear(&work_os);
  vf->bittrack=0.f;
  vf->samptrack=0.f;
  return(0);
}